

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blob.h
# Opt level: O0

void __thiscall ncnn::Blob::Blob(Blob *this,Blob *param_2)

{
  string *in_RSI;
  Mat *in_RDI;
  Mat *in_stack_ffffffffffffffe0;
  
  std::__cxx11::string::string((string *)in_RDI,in_RSI);
  in_RDI->allocator = *(Allocator **)(in_RSI + 0x20);
  ncnn::Mat::Mat(in_stack_ffffffffffffffe0,in_RDI);
  return;
}

Assistant:

class NCNN_EXPORT Blob
{
public:
    // empty
    Blob();

public:
#if NCNN_STRING
    // blob name
    std::string name;
#endif // NCNN_STRING
    // layer index which produce this blob as output
    int producer;
    // layer index which need this blob as input
    int consumer;
    // shape hint
    Mat shape;
}